

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QRect __thiscall QAccessibleTableCell::rect(QAccessibleTableCell *this)

{
  Data *pDVar1;
  char cVar2;
  QWidget *this_00;
  QPoint QVar4;
  QPoint QVar5;
  int iVar6;
  QObject *pQVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  QWidget *parent;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QRect QVar12;
  QModelIndex local_50;
  long local_38;
  ulong uVar3;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = (**(code **)(*(long *)this + 0x10))();
  if (cVar2 == '\0') {
    auVar11 = ZEXT816(0xffffffff) << 0x40;
    uVar8 = 0;
    uVar10 = 0xffffffff;
  }
  else {
    pDVar1 = (this->view).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar7 = (QObject *)0x0;
    }
    else {
      pQVar7 = (this->view).wp.value;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,&this->m_index);
    auVar11 = (**(code **)(*(long *)pQVar7 + 0x1e0))(pQVar7);
    uVar3 = auVar11._0_8_;
    uVar8 = uVar3 >> 0x20;
    uVar10 = auVar11._8_8_ >> 0x20;
    iVar9 = auVar11._12_4_;
    if (auVar11._4_4_ + -1 != iVar9 || auVar11._0_4_ + -1 != auVar11._8_4_) {
      this_00 = QAbstractScrollArea::viewport((QAbstractScrollArea *)(this->view).wp.value);
      pDVar1 = (this->view).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        parent = (QWidget *)0x0;
      }
      else {
        parent = (QWidget *)(this->view).wp.value;
      }
      local_50.r = 0;
      local_50.c = 0;
      QVar4 = QWidget::mapTo(this_00,parent,(QPoint *)&local_50);
      local_50.r = 0;
      local_50.c = 0;
      QVar5 = QWidget::mapToGlobal((QWidget *)(this->view).wp.value,(QPoint *)&local_50);
      iVar6 = QVar5.yp.m_i.m_i + QVar4.yp.m_i.m_i;
      uVar8 = (ulong)(uint)(auVar11._4_4_ + iVar6);
      auVar11._8_8_ = (long)QVar5 + (long)QVar4 + auVar11._8_8_;
      auVar11._0_8_ = uVar3 + (long)QVar5 + (long)QVar4;
      uVar10 = (ulong)(uint)(iVar9 + iVar6);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  uVar8 = auVar11._0_8_ & 0xffffffff | uVar8 << 0x20;
  QVar12._8_8_ = auVar11._8_8_ & 0xffffffff | uVar10 << 0x20;
  QVar12.x1.m_i = (int)uVar8;
  QVar12.y1.m_i = (int)(uVar8 >> 0x20);
  return QVar12;
}

Assistant:

QRect QAccessibleTableCell::rect() const
{
    QRect r;
    if (!isValid())
        return r;
    r = view->visualRect(m_index);

    if (!r.isNull()) {
        r.translate(view->viewport()->mapTo(view, QPoint(0,0)));
        r.translate(view->mapToGlobal(QPoint(0, 0)));
    }
    return r;
}